

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Gia_ObjComputeEdgeDelay
              (Gia_Man_t *p,int iObj,Vec_Int_t *vDelay,Vec_Int_t *vEdge1,Vec_Int_t *vEdge2,
              int fUseTwo)

{
  uint *puVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  uint *puVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint *puVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  
  if ((iObj < 0) || (vEdge1->nSize <= iObj)) goto LAB_006be56b;
  piVar7 = vEdge1->pArray;
  piVar7[(uint)iObj] = 0;
  if (vEdge2->nSize <= iObj) goto LAB_006be56b;
  piVar2 = vEdge2->pArray;
  piVar2[(uint)iObj] = 0;
  pVVar3 = p->vMapping;
  if (pVVar3 == (Vec_Int_t *)0x0) {
LAB_006be1fa:
    if (p->vMapping2->nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar3 = p->vMapping2->pArray;
    uVar10 = pVVar3[(uint)iObj].nSize;
    uVar9 = (ulong)uVar10;
    if (uVar9 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x163,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (4 < (int)uVar10) {
      __assert_fail("Gia_ObjLutSize2(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x14d,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if ((int)uVar10 < 1) goto LAB_006be58a;
    uVar16 = 0;
    uVar8 = 0xffffffff;
    uVar10 = 0xffffffff;
    iVar19 = 0;
    iVar14 = 0;
    iVar5 = 0;
    do {
      if (uVar9 == uVar16) goto LAB_006be54c;
      uVar17 = pVVar3[(uint)iObj].pArray[uVar16];
      if (((long)(int)uVar17 < 0) || (vDelay->nSize <= (int)uVar17)) goto LAB_006be54c;
      iVar12 = vDelay->pArray[(int)uVar17] + 10;
      if (iVar14 < iVar12) {
        iVar19 = 1;
        iVar13 = iVar12;
        uVar10 = uVar17;
        iVar12 = iVar14;
      }
      else {
        iVar13 = iVar14;
        if (iVar14 == iVar12) {
          iVar19 = iVar19 + 1;
          iVar12 = iVar5;
          uVar8 = uVar17;
          if (fUseTwo == 0) {
            iVar12 = iVar14;
          }
        }
        else if (iVar12 < iVar5) {
          iVar12 = iVar5;
        }
      }
      uVar16 = uVar16 + 1;
      iVar14 = iVar13;
      iVar5 = iVar12;
    } while (uVar9 != uVar16);
  }
  else {
    if (pVVar3->nSize <= iObj) goto LAB_006be54c;
    piVar4 = pVVar3->pArray;
    uVar10 = piVar4[(uint)iObj];
    uVar9 = (ulong)uVar10;
    if (uVar9 == 0) goto LAB_006be1fa;
    if (((int)uVar10 < 0) || ((uint)pVVar3->nSize <= uVar10)) goto LAB_006be54c;
    iVar14 = piVar4[uVar9];
    if (4 < (long)iVar14) {
      __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x135,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (iVar14 < 1) goto LAB_006be58a;
    lVar18 = 0;
    uVar8 = 0xffffffff;
    uVar10 = 0xffffffff;
    iVar19 = 0;
    iVar5 = 0;
    iVar11 = 0;
    do {
      uVar17 = piVar4[uVar9 + lVar18 + 1];
      if (((long)(int)uVar17 < 0) || (vDelay->nSize <= (int)uVar17)) goto LAB_006be54c;
      iVar12 = vDelay->pArray[(int)uVar17] + 10;
      if (iVar5 < iVar12) {
        iVar19 = 1;
        iVar13 = iVar12;
        iVar12 = iVar5;
        uVar10 = uVar17;
      }
      else {
        iVar13 = iVar5;
        if (iVar5 == iVar12) {
          iVar19 = iVar19 + 1;
          iVar12 = iVar11;
          uVar8 = uVar17;
          if (fUseTwo == 0) {
            iVar12 = iVar5;
          }
        }
        else if (iVar12 < iVar11) {
          iVar12 = iVar11;
        }
      }
      lVar18 = lVar18 + 1;
      iVar5 = iVar13;
      iVar11 = iVar12;
    } while (iVar14 != lVar18);
  }
  if (iVar19 < 1) {
LAB_006be58a:
    __assert_fail("nCountMax > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                  ,0x164,
                  "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (10 < iVar13) {
    puVar15 = (uint *)(piVar7 + (uint)iObj);
    puVar1 = (uint *)(piVar2 + (uint)iObj);
    if (iVar19 == 1) {
      if ((((int)uVar10 < 0) || (iVar14 = vEdge1->nSize, iVar14 <= (int)uVar10)) ||
         (vEdge2->nSize <= (int)uVar10)) goto LAB_006be54c;
      if (0 < piVar7[uVar10] && 0 < piVar2[uVar10]) goto LAB_006be2cf;
      if ((piVar7[uVar10] == 0) || (piVar7 = piVar2, piVar2[uVar10] == 0)) {
        piVar7[uVar10] = iObj;
        iVar14 = vEdge1->nSize;
      }
      if (iVar14 <= iObj) goto LAB_006be54c;
      if (*puVar15 != 0) {
        if (vEdge2->nSize <= iObj) goto LAB_006be54c;
        puVar15 = puVar1;
        if (*puVar1 != 0) goto LAB_006be537;
      }
      *puVar15 = uVar10;
LAB_006be537:
      if (vDelay->nSize <= iObj) goto LAB_006be56b;
      iVar14 = iVar13 + -8;
      if (iVar13 + -8 < iVar12) {
        iVar14 = iVar12;
      }
      goto LAB_006be2d8;
    }
    if (iVar19 == 2 && fUseTwo != 0) {
      if (((((int)uVar10 < 0) || (uVar17 = vEdge1->nSize, (int)uVar17 <= (int)uVar10)) ||
          (vEdge2->nSize <= (int)uVar10)) ||
         ((((int)uVar8 < 0 || (uVar17 <= uVar8)) || ((uint)vEdge2->nSize <= uVar8))))
      goto LAB_006be54c;
      if ((piVar7[uVar10] < 1 || piVar2[uVar10] < 1) && (piVar7[uVar8] < 1 || piVar2[uVar8] < 1)) {
        piVar4 = piVar7;
        if ((piVar7[uVar10] == 0) || (piVar4 = piVar2, piVar2[uVar10] == 0)) {
          piVar4[uVar10] = iObj;
          uVar17 = vEdge1->nSize;
        }
        if ((int)uVar17 <= (int)uVar8) goto LAB_006be54c;
        piVar7 = piVar7 + uVar8;
        if (*piVar7 == 0) {
LAB_006be4ee:
          *piVar7 = iObj;
          uVar17 = vEdge1->nSize;
        }
        else {
          if (vEdge2->nSize <= (int)uVar8) goto LAB_006be54c;
          piVar7 = piVar2 + uVar8;
          if (*piVar7 == 0) goto LAB_006be4ee;
        }
        if ((int)uVar17 <= iObj) goto LAB_006be54c;
        puVar6 = puVar15;
        if (*puVar15 == 0) {
LAB_006be511:
          *puVar6 = uVar10;
          uVar17 = vEdge1->nSize;
        }
        else {
          if (vEdge2->nSize <= iObj) goto LAB_006be54c;
          puVar6 = puVar1;
          if (*puVar1 == 0) goto LAB_006be511;
        }
        if ((int)uVar17 <= iObj) {
LAB_006be54c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*puVar15 != 0) {
          if (vEdge2->nSize <= iObj) goto LAB_006be54c;
          puVar15 = puVar1;
          if (*puVar1 != 0) goto LAB_006be537;
        }
        *puVar15 = uVar8;
        goto LAB_006be537;
      }
    }
  }
LAB_006be2cf:
  iVar14 = iVar13;
  if (vDelay->nSize <= iObj) {
LAB_006be56b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_006be2d8:
  vDelay->pArray[(uint)iObj] = iVar14;
  return iVar14;
}

Assistant:

int Gia_ObjComputeEdgeDelay( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay, Vec_Int_t * vEdge1, Vec_Int_t * vEdge2, int fUseTwo )
{
    int i, iFan, Delay, Status1, Status2;
    int DelayMax = 0, DelayMax2 = 0, nCountMax = 0;
    int iFanMax1 = -1, iFanMax2 = -1;
    Vec_IntWriteEntry(vEdge1, iObj, 0);
    Vec_IntWriteEntry(vEdge2, iObj, 0);
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry( vDelay, iFan ) + 10;
            if ( DelayMax < Delay )
            {
                DelayMax2 = DelayMax;
                DelayMax  = Delay;
                iFanMax1  = iFan;
                nCountMax = 1;
            }
            else if ( DelayMax == Delay )
            {
                iFanMax2  = iFan;
                nCountMax++;
                if ( !fUseTwo )
                    DelayMax2 = DelayMax;
            }
            else
                DelayMax2 = Abc_MaxInt( DelayMax2, Delay );
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        assert( Gia_ObjLutSize2(p, iObj) <= 4 );
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry( vDelay, iFan ) + 10;
            if ( DelayMax < Delay )
            {
                DelayMax2 = DelayMax;
                DelayMax  = Delay;
                iFanMax1  = iFan;
                nCountMax = 1;
            }
            else if ( DelayMax == Delay )
            {
                iFanMax2  = iFan;
                nCountMax++;
                if ( !fUseTwo )
                    DelayMax2 = DelayMax;
            }
            else
                DelayMax2 = Abc_MaxInt( DelayMax2, Delay );
        }
    }
    else assert( 0 );
    assert( nCountMax > 0 );
    if ( DelayMax <= 10 )
    {} // skip first level
    else if ( nCountMax == 1 )
    {
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        if ( Status1 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            DelayMax = Abc_MaxInt( DelayMax2, DelayMax - 8 );
            Vec_IntWriteEntry( vDelay, iObj, DelayMax );
            return DelayMax;
        }
    }
    else if ( fUseTwo && nCountMax == 2 )
    {
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        Status2 = Gia_ObjEdgeCount( iFanMax2, vEdge1, vEdge2 );
        if ( Status1 <= 1 && Status2 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iFanMax2, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax2, vEdge1, vEdge2 );
            DelayMax = Abc_MaxInt( DelayMax2, DelayMax - 8 );
            Vec_IntWriteEntry( vDelay, iObj, DelayMax );
            return DelayMax;
        }
    }
    Vec_IntWriteEntry( vDelay, iObj, DelayMax );
    return DelayMax;
}